

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.hpp
# Opt level: O1

void __thiscall
oqpi::
worker<oqpi::itfc::thread<oqpi::posix_thread,_oqpi::empty_layer>,_oqpi::itfc::semaphore<oqpi::posix_semaphore,_oqpi::local_sync_object>,_oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::worker_base>_>
::start(worker<oqpi::itfc::thread<oqpi::posix_thread,_oqpi::empty_layer>,_oqpi::itfc::semaphore<oqpi::posix_semaphore,_oqpi::local_sync_object>,_oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::worker_base>_>
        *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint __val;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint __len;
  string __str;
  thread_attributes threadAttributes;
  posix_thread local_80 [2];
  long local_70 [2];
  thread_attributes local_60;
  anon_class_8_1_8991fb9c_for__M_head_impl local_30;
  
  LOCK();
  (this->running_)._M_base._M_i = true;
  UNLOCK();
  paVar1 = &local_60.name_.field_2;
  pcVar2 = (this->super_worker_base).config_.threadAttributes.name_._M_dataplus._M_p;
  local_60.name_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,
             pcVar2 + (this->super_worker_base).config_.threadAttributes.name_._M_string_length);
  local_60.priority_ = (this->super_worker_base).config_.threadAttributes.priority_;
  local_60.stackSize_ = (this->super_worker_base).config_.threadAttributes.stackSize_;
  local_60.coreAffinityMask_ = (this->super_worker_base).config_.threadAttributes.coreAffinityMask_;
  __val = (this->super_worker_base).id_;
  if (-1 < (int)__val) {
    __len = 1;
    if (9 < __val) {
      uVar5 = __val;
      uVar4 = 4;
      do {
        __len = uVar4;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_00174bc0;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_00174bc0;
        }
        if (uVar5 < 10000) goto LAB_00174bc0;
        bVar3 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        uVar4 = __len + 4;
      } while (bVar3);
      __len = __len + 1;
    }
LAB_00174bc0:
    local_80[0].handle_ = (native_handle_type)local_70;
    std::__cxx11::string::_M_construct((ulong)local_80,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_80[0].handle_,__len,__val);
    std::__cxx11::string::_M_append((char *)&local_60,local_80[0].handle_);
    if ((long *)local_80[0].handle_ != local_70) {
      operator_delete((void *)local_80[0].handle_,local_70[0] + 1);
    }
  }
  local_30.this = this;
  itfc::thread<oqpi::posix_thread,oqpi::empty_layer>::
  thread<oqpi::worker<oqpi::itfc::thread<oqpi::posix_thread,oqpi::empty_layer>,oqpi::itfc::semaphore<oqpi::posix_semaphore,oqpi::local_sync_object>,oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::worker_base>>::start()::_lambda()_1_>
            ((thread<oqpi::posix_thread,oqpi::empty_layer> *)local_80,&local_60,&local_30);
  itfc::thread<oqpi::posix_thread,_oqpi::empty_layer>::operator=
            (&this->thread_,(self_type *)local_80);
  if ((long *)local_80[0].handle_ == (long *)0x0) {
    posix_thread::~posix_thread(local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.name_._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.name_._M_dataplus._M_p,
                      local_60.name_.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::terminate();
}

Assistant:

virtual void start() override final
        {
            // Important to set the worker as running before starting the thread
            running_.store(true);

            // Add the id to the worker name so we can differentiate them when several workers
            // share the same config (and thus the same name)
            auto threadAttributes = worker_base::config_.threadAttributes;
            if (id_ >= 0)
            {
                threadAttributes.name_ += std::to_string(id_);
            }

            // Start the thread, running_ must be set to true beforehand
            thread_ = _Thread(threadAttributes, [this]() { run(); });
        }